

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>::
pod_vector(pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
           *this,pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
                 *other)

{
  pointer __src;
  allocator<Clasp::DomainTable::ValueType> local_11;
  
  ebo::ebo(&this->ebo_,(other->ebo_).size,&local_11);
  __src = (other->ebo_).buf;
  if (__src != (pointer)0x0) {
    memcpy((this->ebo_).buf,__src,(ulong)(other->ebo_).size * 0xc);
  }
  (this->ebo_).size = (other->ebo_).size;
  return;
}

Assistant:

pod_vector(const pod_vector& other) : ebo_(other.size(), other.get_allocator()) {
		if (const_pointer buf = other.begin()) {
			std::memcpy(ebo_.buf, buf, other.size()*sizeof(T));
		}
		ebo_.size = other.size();
	}